

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O1

void __thiscall
OSTEI_HRR_Algorithm_Base::Create
          (OSTEI_HRR_Algorithm_Base *this,set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *am,
          RRStepType brasteptype,RRStepType ketsteptype)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RRStepType steptype;
  _Rb_tree_node_base *p_Var3;
  mapped_type *pmVar4;
  _Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> *p_Var5;
  _Base_ptr p_Var6;
  pointer pHVar7;
  char *__end;
  long lVar8;
  HRRDoubletStep *pHVar9;
  char *__end_1;
  pointer pHVar10;
  DoubletSet add_targets_1;
  HRRDoubletStepList brasteps;
  HRRDoubletStepList ketsteps;
  DoubletSet initbras;
  DoubletSet solvedbras;
  DoubletSet targets;
  DoubletSet solvedkets;
  DoubletSet prunedbra;
  DoubletSet prunedket;
  DoubletSet initkets;
  undefined1 local_328 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Type local_2f8;
  undefined8 uStack_2f0;
  RRStepType local_2e4;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  HRRDoubletStepList local_298;
  HRRDoubletStepList local_278;
  undefined1 local_260 [40];
  size_t local_238;
  HRR_StepMap *local_230;
  undefined1 local_228 [40];
  size_t local_200;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_1f8;
  DAM local_1c8;
  DAM local_1a0;
  undefined1 local_178 [16];
  _Alloc_hider local_168;
  char local_158 [16];
  DAM local_148;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_120;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_f0;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_c0;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_90;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_60;
  
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_120._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_120._M_impl.super__Rb_tree_header._M_header;
  local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (am->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(am->_M_t)._M_impl.super__Rb_tree_header;
  local_2e4 = brasteptype;
  local_2e0 = &am->_M_t;
  local_120._M_impl.super__Rb_tree_header._M_header._M_right =
       local_120._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    paVar2 = &local_1a0.tag.field_2;
    do {
      local_2f8 = (_Type)p_Var3[1]._M_parent;
      uStack_2f0 = 0;
      local_2b8 = &local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"","");
      local_1a0.dam._M_elems[0] = local_2f8[0];
      local_1a0.dam._M_elems[1] = local_2f8[1];
      if (local_2b8 == &local_2a8) {
        local_1a0.tag.field_2._8_8_ = local_2a8._8_8_;
        local_1a0.tag._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1a0.tag._M_dataplus._M_p = (pointer)local_2b8;
      }
      local_1a0.tag.field_2._M_allocated_capacity._1_7_ = local_2a8._M_allocated_capacity._1_7_;
      local_1a0.tag.field_2._M_local_buf[0] = local_2a8._M_local_buf[0];
      local_1a0.tag._M_string_length = local_2b0;
      local_2b0 = 0;
      local_2a8._M_local_buf[0] = '\0';
      local_2b8 = &local_2a8;
      GenerateDoubletTargets((DoubletSet *)&local_1f8,&local_1a0,KET);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0.tag._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a0.tag._M_dataplus._M_p);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8);
      }
      std::
      _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<Doublet>>
                ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                  *)&local_90,
                 (_Rb_tree_const_iterator<Doublet>)
                 local_1f8._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<Doublet>)&local_1f8._M_impl.super__Rb_tree_header);
      std::
      _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
      ::~_Rb_tree(&local_1f8);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::_Rb_tree(&local_1f8,&local_90);
  PruneDoublets_((DoubletSet *)&local_1f8,(DoubletSet *)&local_c0,ketsteptype);
  local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_start = (HRRDoubletStep *)0x0;
  local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_finish = (HRRDoubletStep *)0x0;
  local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HRRDoubletLoop_(this,&local_278,(DoubletSet *)&local_1f8,(DoubletSet *)&local_120,
                  (DoubletSet *)&local_c0,ketsteptype);
  pHVar9 = local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  pHVar7 = local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start < pHVar9 &&
      local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::swap<HRRDoubletStep>(pHVar7,pHVar9);
      pHVar7 = pHVar7 + 1;
      pHVar9 = pHVar9 + -1;
    } while (pHVar7 < pHVar9);
  }
  pHVar7 = local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_230 = &this->ketsteps_;
    local_2f8 = (_Type)&this->ketreq_;
    pHVar10 = local_278.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Doublet::amlist((DAM *)local_260,&pHVar10->target);
      pmVar4 = std::
               map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
               ::operator[](local_230,(DAM *)local_260);
      std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back(pmVar4,pHVar10);
      if ((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_) != local_260 + 0x18) {
        operator_delete((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_));
      }
      lVar8 = 0x48;
      do {
        Doublet::amlist((DAM *)local_260,&pHVar10->target);
        p_Var5 = &std::
                  map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                  ::operator[]((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                                *)local_2f8,(DAM *)local_260)->_M_t;
        Doublet::amlist((DAM *)local_228,(Doublet *)((long)(&(pHVar10->target).left + -1) + lVar8));
        std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
        _M_insert_unique<DAM>(p_Var5,(DAM *)local_228);
        if ((undefined1 *)CONCAT44(local_228._12_4_,local_228._8_4_) != local_228 + 0x18) {
          operator_delete((undefined1 *)CONCAT44(local_228._12_4_,local_228._8_4_));
        }
        if ((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_) != local_260 + 0x18) {
          operator_delete((undefined1 *)CONCAT44(local_260._12_4_,local_260._8_4_));
        }
        lVar8 = lVar8 + 0x40;
      } while (lVar8 != 200);
      pHVar10 = pHVar10 + 1;
    } while (pHVar10 != pHVar7);
  }
  local_260._24_8_ = local_260 + 8;
  local_260._8_4_ = _S_red;
  local_260._16_8_ = (_Base_ptr)0x0;
  local_238 = 0;
  local_228._24_8_ = local_228 + 8;
  local_228._8_4_ = _S_red;
  local_228._16_8_ = (_Base_ptr)0x0;
  local_200 = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (((_Rep_type *)&local_2e0->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left;
  local_260._32_8_ = local_260._24_8_;
  local_228._32_8_ = local_228._24_8_;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    paVar2 = &local_1c8.tag.field_2;
    do {
      local_2f8[0] = p_Var3[1]._M_color;
      local_2f8[1] = *(int *)&p_Var3[1].field_0x4;
      uStack_2f0 = 0;
      local_2d8 = &local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"","");
      local_1c8.dam._M_elems[0] = local_2f8[0];
      local_1c8.dam._M_elems[1] = local_2f8[1];
      if (local_2d8 == &local_2c8) {
        local_1c8.tag.field_2._8_8_ = local_2c8._8_8_;
        local_1c8.tag._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_1c8.tag._M_dataplus._M_p = (pointer)local_2d8;
      }
      local_1c8.tag.field_2._M_allocated_capacity._1_7_ = local_2c8._M_allocated_capacity._1_7_;
      local_1c8.tag.field_2._M_local_buf[0] = local_2c8._M_local_buf[0];
      local_1c8.tag._M_string_length = local_2d0;
      local_2d0 = 0;
      local_2c8._M_local_buf[0] = '\0';
      local_2d8 = &local_2c8;
      GenerateDoubletTargets((DoubletSet *)local_328,&local_1c8,BRA);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.tag._M_dataplus._M_p != paVar2) {
        operator_delete(local_1c8.tag._M_dataplus._M_p);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      std::
      _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<Doublet>>
                ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                  *)local_260,(_Rb_tree_const_iterator<Doublet>)local_310._M_allocated_capacity,
                 (_Base_ptr)(local_328 + 8));
      std::
      _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
      ::~_Rb_tree((_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                   *)local_328);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::operator=(&local_1f8,
              (_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
               *)local_260);
  steptype = local_2e4;
  PruneDoublets_((DoubletSet *)&local_1f8,(DoubletSet *)&local_f0,local_2e4);
  local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_start = (HRRDoubletStep *)0x0;
  local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_finish = (HRRDoubletStep *)0x0;
  local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  HRRDoubletLoop_(this,&local_298,(DoubletSet *)&local_1f8,(DoubletSet *)local_228,
                  (DoubletSet *)&local_f0,steptype);
  pHVar9 = local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  pHVar7 = local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start < pHVar9 &&
      local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::swap<HRRDoubletStep>(pHVar7,pHVar9);
      pHVar7 = pHVar7 + 1;
      pHVar9 = pHVar9 + -1;
    } while (pHVar7 < pHVar9);
  }
  pHVar7 = local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_2f8 = (_Type)&this->brareq_;
    pHVar10 = local_298.super__Vector_base<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      Doublet::amlist((DAM *)local_328,&pHVar10->target);
      pmVar4 = std::
               map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
               ::operator[](&this->brasteps_,(DAM *)local_328);
      std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back(pmVar4,pHVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._8_8_ != &local_310) {
        operator_delete((void *)local_328._8_8_);
      }
      lVar8 = 0x48;
      do {
        Doublet::amlist((DAM *)local_328,&pHVar10->target);
        p_Var5 = &std::
                  map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                  ::operator[]((map<DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::set<DAM,_std::less<DAM>,_std::allocator<DAM>_>_>_>_>
                                *)local_2f8,(DAM *)local_328)->_M_t;
        Doublet::amlist(&local_148,(Doublet *)((long)(&(pHVar10->target).left + -1) + lVar8));
        std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
        _M_insert_unique<DAM>(p_Var5,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.tag._M_dataplus._M_p != &local_148.tag.field_2) {
          operator_delete(local_148.tag._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._8_8_ != &local_310) {
          operator_delete((void *)local_328._8_8_);
        }
        lVar8 = lVar8 + 0x40;
      } while (lVar8 != 200);
      pHVar10 = pHVar10 + 1;
    } while (pHVar10 != pHVar7);
  }
  p_Var1 = &local_120._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_node_base *)local_228._24_8_ != (_Rb_tree_node_base *)(local_228 + 8)) {
    p_Var3 = (_Rb_tree_node_base *)local_228._24_8_;
    do {
      Doublet::amlist((DAM *)local_328,(Doublet *)(p_Var3 + 1));
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
      _M_insert_unique<DAM>(&(this->allbraam_)._M_t,(DAM *)local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._8_8_ != &local_310) {
        operator_delete((void *)local_328._8_8_);
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != (_Rb_tree_node_base *)(local_228 + 8));
  }
  if ((_Rb_tree_header *)local_120._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var6 = local_120._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      Doublet::amlist((DAM *)local_328,(Doublet *)(p_Var6 + 1));
      std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::
      _M_insert_unique<DAM>(&(this->allketam_)._M_t,(DAM *)local_328);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._8_8_ != &local_310) {
        operator_delete((void *)local_328._8_8_);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::_Rb_tree
            (&local_60,local_2e0);
  AMOrder_AddWithDependencies_
            (this,&this->amorder_,&this->topqam_,&this->stepmap_,(QAMSet *)&local_60);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_60);
  p_Var3 = (this->topqam_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->topqam_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      local_178._0_4_ = p_Var3[1]._M_color;
      local_178._4_4_ = *(undefined4 *)&p_Var3[1].field_0x4;
      local_178._8_4_ = *(undefined4 *)&p_Var3[1]._M_parent;
      local_178._12_4_ = *(int *)((long)&p_Var3[1]._M_parent + 4);
      local_168._M_p = local_158;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_168,p_Var3[1]._M_left,
                 (long)&(p_Var3[1]._M_left)->_M_color + (long)&(p_Var3[1]._M_right)->_M_color);
      GenerateQuartetTargets((QuartetSet *)local_328,(QAM *)local_178);
      if (local_168._M_p != local_158) {
        operator_delete(local_168._M_p);
      }
      std::
      _Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>::
      _M_insert_range_unique<std::_Rb_tree_const_iterator<Quartet>>
                ((_Rb_tree<Quartet,Quartet,std::_Identity<Quartet>,std::less<Quartet>,std::allocator<Quartet>>
                  *)&this->topquartets_,
                 (_Rb_tree_const_iterator<Quartet>)local_310._M_allocated_capacity,
                 (_Base_ptr)(local_328 + 8));
      std::
      _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
      ::~_Rb_tree((_Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                   *)local_328);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_298);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree((_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
               *)local_228);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree((_Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
               *)local_260);
  std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::~vector(&local_278);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_1f8);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::Create(std::set<QAM> am,
                                      RRStepType brasteptype,
                                      RRStepType ketsteptype)
{
    // we need the kets from the original targets
    DoubletSet initkets, solvedkets, prunedket;

    for(auto & iam : am)
    {
        // strip of the tag here
        auto add_targets = GenerateDoubletTargets({iam[2],iam[3]}, DoubletType::KET);
        initkets.insert(add_targets.begin(), add_targets.end());
    }

    DoubletSet targets = initkets;
    PruneDoublets_(targets, prunedket, ketsteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial ket targets");

    // Solve the ket part
    HRRDoubletStepList ketsteps;
    HRRDoubletLoop_(ketsteps, targets, solvedkets, prunedket, ketsteptype);
    std::reverse(ketsteps.begin(), ketsteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : ketsteps)
    {
        ketsteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            ketreq_[it.target.amlist()].insert(it2.amlist());
    }
    

    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "KET HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : ketsteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */


    // we need the bras from the original targets
    DoubletSet initbras, solvedbras, prunedbra;
    for(auto & iam : am)
    {
        // this strips off the tag
        auto add_targets = GenerateDoubletTargets({iam[0],iam[1]}, DoubletType::BRA);
        initbras.insert(add_targets.begin(), add_targets.end());
    }


    // Initial bra targets
    targets = initbras;
    PruneDoublets_(targets, prunedbra, brasteptype);

    //std::cout << "\n\n";
    //PrintDoubletSet(targets, "Initial bra targets");

    // Solve the bra part
    HRRDoubletStepList brasteps;
    HRRDoubletLoop_(brasteps, targets, solvedbras, prunedbra, brasteptype);
    std::reverse(brasteps.begin(), brasteps.end());

    // store in map by AM
    // and store requirements
    for(const auto & it : brasteps)
    {
        brasteps_[it.target.amlist()].push_back(it);
        for(const auto & it2 : it.src)
            brareq_[it.target.amlist()].insert(it2.amlist());
    }


    /*
    std::cout << "\n\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    std::cout << "BRA HRR step done.\n";
    std::cout << "--------------------------------------------------------------------------------\n";
    for(const auto & it : brasteps_)
    for(const auto & it2 : it.second)
        std::cout << it2 << "\n";
    */

    // solved info
    for(const auto & it : solvedbras)
        allbraam_.insert(it.amlist());
    for(const auto & it : solvedkets)
        allketam_.insert(it.amlist());

    // Put am in the order of calculation
    AMOrder_AddWithDependencies_(amorder_, topqam_, stepmap_, am);

    // form the top quartets
    for(auto & it : topqam_)
    {
        auto amquartets = GenerateQuartetTargets(it);
        topquartets_.insert(amquartets.begin(), amquartets.end());
    }

    //PrintQuartetSet(topquartets_, "HRR top quartets");
}